

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O2

fio_str_info_s * fio_str2str(fio_str_info_s *__return_storage_ptr__,FIOBJ o)

{
  fio_str_info(__return_storage_ptr__,(fio_str_s_conflict *)((o & 0xfffffffffffffff8) + 0x10));
  return __return_storage_ptr__;
}

Assistant:

static fio_str_info_s fio_str2str(const FIOBJ o) {
  return fiobj_str_get_cstr(o);
}